

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir-gen.c
# Opt level: O3

void update_call_mem_live(gen_ctx_t gen_ctx,bitmap_t mem_live,MIR_insn_t call_insn)

{
  void **ppvVar1;
  MIR_alias_t MVar2;
  uint uVar3;
  MIR_type_t type;
  bitmap_el_t *pbVar4;
  MIR_context_t ctx;
  long lVar5;
  MIR_item_t pMVar6;
  VARR_mem_attr_t *pVVar7;
  size_t sVar8;
  ulong uVar9;
  MIR_item_t pMVar10;
  MIR_item_t pMVar11;
  ulong uVar12;
  char *pcVar13;
  bitmap_t bm;
  MIR_alias_t *pMVar14;
  bitmap_t nb;
  long lVar15;
  gen_ctx_t pgVar16;
  int in_R8D;
  undefined1 *puVar17;
  mem_attr_t *pmVar18;
  size_t sVar19;
  
  if ((int)*(ulong *)&call_insn->field_0x18 - 0xaaU < 0xfffffffd) {
    __assert_fail("MIR_call_code_p (call_insn->code)",
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                  ,0x1366,"void update_call_mem_live(gen_ctx_t, bitmap_t, MIR_insn_t)");
  }
  if ((call_insn->ops[0].field_0x8 != '\b') ||
     (pMVar11 = call_insn->ops[0].u.ref, pMVar11->item_type != MIR_proto_item)) goto LAB_00167a33;
  nb = mem_live;
  pgVar16 = gen_ctx;
  if (gen_ctx->full_escape_p == '\0') {
    pMVar6 = (MIR_item_t)(*(ulong *)&call_insn->field_0x18 >> 0x20);
    pMVar10 = (MIR_item_t)(ulong)(((pMVar11->u).proto)->nres + 1);
    pMVar11 = pMVar10;
    if (pMVar10 < pMVar6) {
      nb = (bitmap_t)-(long)pMVar6;
      pMVar11 = (MIR_item_t)((long)&pMVar10->data + 1);
      pcVar13 = &call_insn->ops[(long)pMVar10].field_0x8;
      pgVar16 = (gen_ctx_t)CONCAT71((int7)((ulong)((long)pMVar10 * 0x30) >> 8),1);
      do {
        if ((((*pcVar13 == '\v') || (*pcVar13 == '\x02')) && (*(long *)(pcVar13 + -8) != 0)) &&
           (puVar17 = *(undefined1 **)(*(long *)(pcVar13 + -8) + 8), (puVar17[9] & 3) != 0)) break;
        puVar17 = (undefined1 *)((long)&nb->els_num + 1) + (long)pMVar11;
        pgVar16 = (gen_ctx_t)CONCAT71((int7)((ulong)pgVar16 >> 8),pMVar11 < pMVar6);
        pMVar11 = (MIR_item_t)((long)&pMVar11->data + 1);
        pcVar13 = pcVar13 + 0x30;
      } while (puVar17 != &DAT_00000001);
      in_R8D = (int)puVar17;
      if ((char)pgVar16 != '\0') goto LAB_001678ab;
    }
    pVVar7 = gen_ctx->mem_attrs;
    if (pVVar7 != (VARR_mem_attr_t *)0x0) {
      pmVar18 = pVVar7->varr;
      uVar9 = 1;
      do {
        pmVar18 = pmVar18 + 1;
        if (pVVar7->els_num <= uVar9) {
          return;
        }
        if (pmVar18->alloca_flag == '\0') {
          bitmap_expand(mem_live,uVar9 + 1);
          if (mem_live == (bitmap_t)0x0) goto LAB_00167a2e;
          mem_live->varr[uVar9 >> 6] = mem_live->varr[uVar9 >> 6] | 1L << (uVar9 & 0x3f);
          pVVar7 = gen_ctx->mem_attrs;
        }
        uVar9 = uVar9 + 1;
      } while (pVVar7 != (VARR_mem_attr_t *)0x0);
      update_call_mem_live_cold_1();
LAB_00167a2e:
      update_call_mem_live_cold_2();
LAB_00167a33:
      __assert_fail("call_insn->ops[0].mode == MIR_OP_REF && call_insn->ops[0].u.ref->item_type == MIR_proto_item"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                    ,0x1368,"void update_call_mem_live(gen_ctx_t, bitmap_t, MIR_insn_t)");
    }
  }
  else {
LAB_001678ab:
    if (gen_ctx->mem_attrs == (VARR_mem_attr_t *)0x0) {
      update_call_mem_live_cold_5();
    }
    else {
      sVar19 = gen_ctx->mem_attrs->els_num;
      nb = (bitmap_t)(sVar19 + 1);
      pgVar16 = (gen_ctx_t)mem_live;
      bitmap_expand(mem_live,(size_t)nb);
      if (mem_live != (bitmap_t)0x0) {
        if (sVar19 != 0) {
          pbVar4 = mem_live->varr;
          uVar9 = 1;
          do {
            uVar12 = (ulong)((uint)uVar9 & 0x3f);
            lVar15 = 0x40 - (ulong)((int)sVar19 + (uint)uVar9 & 0x3f);
            if (0x40 - uVar12 <= sVar19) {
              lVar15 = 0;
            }
            pbVar4[uVar9 >> 6] =
                 pbVar4[uVar9 >> 6] | (0xffffffffffffffffU >> (lVar15 + uVar12 & 0x3f)) << uVar12;
            lVar15 = 0x40 - (lVar15 + uVar12);
            uVar9 = uVar9 + lVar15;
            sVar19 = sVar19 - lVar15;
          } while (sVar19 != 0);
        }
        return;
      }
    }
    update_call_mem_live_cold_4();
  }
  update_call_mem_live_cold_3();
  pVVar7 = pgVar16->mem_attrs;
  if (pVVar7 == (VARR_mem_attr_t *)0x0) {
    make_live_from_mem_cold_3();
  }
  else if ((char)nb->size == '\v') {
    uVar9 = 1;
    pMVar14 = &pVVar7->varr[1].nonalias;
    do {
      if (pVVar7->els_num <= uVar9) {
        return;
      }
      MVar2 = *(MIR_alias_t *)((long)&nb->varr + 4);
      if ((((MVar2 == pMVar14[-1]) || (MVar2 == 0)) || (pMVar14[-1] == 0)) &&
         (MVar2 = (MIR_alias_t)nb[1].els_num, (*pMVar14 == 0 || MVar2 == 0) || MVar2 != *pMVar14)) {
        if ((in_R8D != 0) && ((((mem_attr_t *)(pMVar14 + -3))->alloca_flag & 2) != 0)) {
          uVar12 = uVar9 & 0xffffffff;
          if ((uVar12 == 0) || (uVar3 = *(uint *)((long)&nb[1].els_num + 4), uVar3 == 0))
          goto LAB_00167c47;
          pmVar18 = pVVar7->varr;
          if ((((pmVar18[uVar3].disp_def_p != '\0') && (pmVar18[uVar12].disp_def_p != '\0')) &&
              (pmVar18[uVar3].def_insn != (MIR_insn_t)0x0)) &&
             (pmVar18[uVar3].def_insn == pmVar18[uVar12].def_insn)) {
            type = pMVar14[-2];
            ctx = pgVar16->ctx;
            lVar15 = pmVar18[uVar3].disp;
            lVar5 = pmVar18[uVar12].disp;
            sVar19 = _MIR_type_size(ctx,(uint)*(byte *)&nb->varr);
            sVar8 = _MIR_type_size(ctx,type);
            if (((lVar15 < lVar5) || ((long)(sVar8 + lVar5) <= lVar15)) &&
               ((lVar5 < lVar15 || ((long)(sVar19 + lVar15) <= lVar5)))) goto LAB_00167c17;
          }
        }
        bitmap_expand(bm,uVar9 + 1);
        if (bm == (bitmap_t)0x0) {
          make_live_from_mem_cold_1();
LAB_00167c47:
          __assert_fail("nloc1 != 0 && nloc2 != 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                        ,0x137a,
                        "int alloca_mem_intersect_p(gen_ctx_t, uint32_t, MIR_type_t, uint32_t, MIR_type_t)"
                       );
        }
        uVar12 = 1L << (uVar9 & 0x3f);
        bm->varr[uVar9 >> 6] = bm->varr[uVar9 >> 6] | uVar12;
        if ((pMVar11 != (MIR_item_t)0x0) && (uVar9 < (ulong)((long)pMVar11->data << 6))) {
          ppvVar1 = &((pMVar11->item_link).prev)->data + (uVar9 >> 6);
          *ppvVar1 = (void *)((ulong)*ppvVar1 & ~uVar12);
        }
      }
LAB_00167c17:
      pVVar7 = pgVar16->mem_attrs;
      uVar9 = uVar9 + 1;
      pMVar14 = pMVar14 + 8;
      if (pVVar7 == (VARR_mem_attr_t *)0x0) {
        make_live_from_mem_cold_2();
        return;
      }
    } while( true );
  }
  __assert_fail("mem_ref->mode == MIR_OP_VAR_MEM",
                "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                ,0x138a,"void make_live_from_mem(gen_ctx_t, MIR_op_t *, bitmap_t, bitmap_t, int)");
}

Assistant:

static void update_call_mem_live (gen_ctx_t gen_ctx, bitmap_t mem_live, MIR_insn_t call_insn) {
  gen_assert (MIR_call_code_p (call_insn->code));
  gen_assert (call_insn->ops[0].mode == MIR_OP_REF
              && call_insn->ops[0].u.ref->item_type == MIR_proto_item);
  if (full_escape_p || alloca_arg_p (gen_ctx, call_insn)) {
    bitmap_set_bit_range_p (mem_live, 1, VARR_LENGTH (mem_attr_t, mem_attrs));
  } else {
    mem_attr_t *mem_attr_addr = VARR_ADDR (mem_attr_t, mem_attrs);

    for (size_t i = 1; i < VARR_LENGTH (mem_attr_t, mem_attrs); i++)
      if (!mem_attr_addr[i].alloca_flag) bitmap_set_bit_p (mem_live, i);
  }
}